

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_2b61f2f::Parser::State::~State(State *this)

{
  pointer psVar1;
  pointer puVar2;
  pointer psVar3;
  _Hash_node_base *p_Var4;
  __buckets_ptr pp_Var5;
  _Hash_node_base *p_Var6;
  
  psVar1 = (this->expected_operands).
           super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (psVar1 != (pointer)0x0) {
    operator_delete(psVar1,(long)(this->expected_operands).
                                 super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)psVar1);
  }
  puVar2 = (this->endian_converted_words).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->endian_converted_words).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  psVar3 = (this->operands).
           super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (psVar3 != (pointer)0x0) {
    operator_delete(psVar3,(long)(this->operands).
                                 super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)psVar3);
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spv_ext_inst_type_t>,_std::allocator<std::pair<const_unsigned_int,_spv_ext_inst_type_t>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->import_id_to_ext_inst_type)._M_h);
  p_Var6 = (this->type_id_to_number_type_info)._M_h._M_before_begin._M_nxt;
  while (p_Var6 != (_Hash_node_base *)0x0) {
    p_Var4 = p_Var6->_M_nxt;
    operator_delete(p_Var6,0x18);
    p_Var6 = p_Var4;
  }
  memset((this->type_id_to_number_type_info)._M_h._M_buckets,0,
         (this->type_id_to_number_type_info)._M_h._M_bucket_count << 3);
  (this->type_id_to_number_type_info)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->type_id_to_number_type_info)._M_h._M_element_count = 0;
  pp_Var5 = (this->type_id_to_number_type_info)._M_h._M_buckets;
  if (&(this->type_id_to_number_type_info)._M_h._M_single_bucket != pp_Var5) {
    operator_delete(pp_Var5,(this->type_id_to_number_type_info)._M_h._M_bucket_count << 3);
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->id_to_type_id)._M_h);
  return;
}

Assistant:

State(const uint32_t* words_arg, size_t num_words_arg,
          spv_diagnostic* diagnostic_arg)
        : words(words_arg),
          num_words(num_words_arg),
          diagnostic(diagnostic_arg),
          word_index(0),
          instruction_count(0),
          endian(),
          requires_endian_conversion(false) {
      // Temporary storage for parser state within a single instruction.
      // Most instructions require fewer than 25 words or operands.
      operands.reserve(25);
      endian_converted_words.reserve(25);
      expected_operands.reserve(25);
    }